

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

char * Extra_FileReadContents2(char *pFileName,char *pFileName2)

{
  FILE *__stream;
  FILE *__stream_00;
  char *local_38;
  char *pBuffer;
  FILE *pFile2;
  FILE *pFile;
  char *pFileName2_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  __stream_00 = fopen(pFileName2,"rb");
  if ((__stream == (FILE *)0x0) || (__stream_00 == (FILE *)0x0)) {
    local_38 = (char *)0x0;
  }
  else {
    local_38 = Extra_FileRead2((FILE *)__stream,(FILE *)__stream_00);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  return local_38;
}

Assistant:

char * Extra_FileReadContents2( char * pFileName, char * pFileName2 )
{
    FILE * pFile, * pFile2;
    char * pBuffer;
    pFile  = fopen( pFileName, "rb" );
    pFile2 = fopen( pFileName2, "rb" );
    pBuffer = (pFile && pFile2) ? Extra_FileRead2( pFile, pFile2 ) : NULL;
    if ( pFile )  fclose( pFile );
    if ( pFile2 ) fclose( pFile2 );
    return pBuffer;
}